

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O0

ecs_table_t * find_or_create_table_exclude(ecs_world_t *world,ecs_table_t *node,ecs_entity_t remove)

{
  ecs_vector_t *vector;
  long lVar1;
  ecs_world_t *next;
  undefined8 uStack_60;
  undefined1 auStack_58 [16];
  ecs_table_t *result;
  ecs_entities_t entities;
  int32_t count;
  ecs_type_t type;
  ecs_entity_t remove_local;
  ecs_table_t *node_local;
  ecs_world_t *world_local;
  
  vector = node->type;
  uStack_60 = 0x138898;
  entities.array._0_4_ = ecs_vector_count(vector);
  lVar1 = -((long)((int32_t)entities.array << 3) + 0xfU & 0xfffffffffffffff0);
  result = (ecs_table_t *)(auStack_58 + lVar1);
  entities._12_4_ = (int32_t)entities.array;
  *(undefined8 *)(auStack_58 + lVar1 + -8) = 0x1388d0;
  remove_entity_from_type(vector,remove,(ecs_entities_t *)&result);
  *(undefined8 *)(auStack_58 + lVar1 + -8) = 0x1388dd;
  next = (ecs_world_t *)ecs_table_find_or_create(world,(ecs_entities_t *)&result);
  if (next == (ecs_world_t *)0x0) {
    world_local = (ecs_world_t *)0x0;
  }
  else {
    auStack_58._8_8_ = next;
    if (next != (ecs_world_t *)node) {
      *(undefined8 *)(auStack_58 + lVar1 + -8) = 0x13890d;
      create_backlink_after_remove((ecs_table_t *)next,node,remove);
    }
    world_local = (ecs_world_t *)auStack_58._8_8_;
  }
  return (ecs_table_t *)world_local;
}

Assistant:

static
ecs_table_t *find_or_create_table_exclude(
    ecs_world_t * world,
    ecs_table_t * node,
    ecs_entity_t remove)
{
    ecs_type_t type = node->type;
    int32_t count = ecs_vector_count(type);

    ecs_entities_t entities = {
        .array = ecs_os_alloca(ECS_SIZEOF(ecs_entity_t) * count),
        .count = count
    };

    remove_entity_from_type(type, remove, &entities);

    ecs_table_t *result = ecs_table_find_or_create(world, &entities);
    if (!result) {
        return NULL;
    }

    if (result != node) {
        create_backlink_after_remove(result, node, remove);
    }

    return result;    
}